

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cxx
# Opt level: O0

bool __thiscall libcalc::Token::push(Token *this,char symbol)

{
  char cVar1;
  bool bVar2;
  char st;
  char symbol_local;
  Token *this_local;
  
  cVar1 = symbolType(symbol);
  if (cVar1 == '\x03') {
    this_local._7_1_ = false;
  }
  else if ((this->type == '\x02') && (cVar1 == this->type)) {
    std::__cxx11::string::operator+=((string *)this,symbol);
    this_local._7_1_ = true;
  }
  else if (this->type == '\0') {
    this->type = cVar1;
    std::__cxx11::string::operator=((string *)this,symbol);
    this_local._7_1_ = true;
  }
  else if (((this->type == '\x01') && (cVar1 == '\x02')) &&
          (bVar2 = std::operator==(&this->value,"-"), bVar2)) {
    this->type = '\x02';
    std::__cxx11::string::operator+=((string *)this,symbol);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Token::push(const char symbol) {
  char st = symbolType(symbol);

  if (st == TOKEN_TYPE.GARBAGE) {
    return false;
  }

  if (type == TOKEN_TYPE.SYMBOL && st == type) {
    value += symbol;
    return true;
  }

  if (type == TOKEN_TYPE.EMPTY) {
    type = st;
    value = symbol;
    return true;
  }

  if (type == TOKEN_TYPE.OPERATOR &&
      st == TOKEN_TYPE.SYMBOL     &&
      value == "-" ) {
    type = st;
    value += symbol;
    return true;
  }

  return false;
}